

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

Vector2i __thiscall
sf::RenderTarget::mapCoordsToPixel(RenderTarget *this,Vector2f *point,View *view)

{
  Vector2f VVar1;
  Transform *this_00;
  Vector2i VVar2;
  IntRect IVar3;
  undefined4 local_28;
  undefined4 uStack_24;
  
  this_00 = View::getTransform(view);
  VVar1 = Transform::transformPoint(this_00,point);
  IVar3 = getViewport(this,view);
  local_28 = VVar1.x;
  uStack_24 = VVar1.y;
  VVar2.x = (int)((float)IVar3.left + (float)IVar3.width * (local_28 + 1.0) * 0.5);
  VVar2.y = (int)((float)IVar3.top + (float)IVar3.height * (1.0 - uStack_24) * 0.5);
  return VVar2;
}

Assistant:

Vector2i RenderTarget::mapCoordsToPixel(const Vector2f& point, const View& view) const
{
    // First, transform the point by the view matrix
    Vector2f normalized = view.getTransform().transformPoint(point);

    // Then convert to viewport coordinates
    Vector2i pixel;
    IntRect viewport = getViewport(view);
    pixel.x = static_cast<int>(( normalized.x + 1.f) / 2.f * viewport.width  + viewport.left);
    pixel.y = static_cast<int>((-normalized.y + 1.f) / 2.f * viewport.height + viewport.top);

    return pixel;
}